

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.c
# Opt level: O2

int Instructions(int loc)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  OpTab *pOVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  
  if (optabsize == 0) {
    uVar3 = 0;
    for (pOVar7 = MnemTab; pOVar7->Mnem[0] != '\0'; pOVar7 = pOVar7 + 1) {
      uVar3 = uVar3 + 1;
      optabsize = uVar3;
    }
    oplimits[0] = 0;
    uVar8 = 0;
    uVar9 = 0;
    if (0 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    uVar11 = 0;
    oplimits[0x1a] = uVar3;
    while( true ) {
      uVar10 = (ulong)(int)(uint)uVar11;
      if (uVar8 == uVar9) break;
      if ((0x40 < MnemTab[uVar8].Mnem[0]) &&
         (uVar13 = (int)MnemTab[uVar8].Mnem[0] - 0x40, uVar13 != (uint)uVar11)) {
        while( true ) {
          uVar10 = uVar10 + 1;
          if ((long)(ulong)uVar13 <= (long)uVar10) break;
          oplimits[uVar10] = (int)uVar8;
        }
        oplimits[uVar10 & 0xffffffff] = (int)uVar8;
        uVar11 = uVar10 & 0xffffffff;
      }
      uVar8 = uVar8 + 1;
    }
    for (; (long)uVar10 < 0x19; uVar10 = uVar10 + 1) {
      oplimits[uVar10 + 1] = uVar3;
    }
  }
  iVar4 = (int)OpCode[0];
  iVar5 = 0;
  if (iVar4 < 0x40) {
    puVar6 = (uint *)(oplimits + 1);
  }
  else {
    uVar3 = 0;
    if (0x5a < (byte)OpCode[0]) goto LAB_00108b55;
    iVar5 = oplimits[iVar4 - 0x40];
    puVar6 = (uint *)(oplimits + (iVar4 - 0x3f));
  }
  uVar3 = *puVar6;
LAB_00108b55:
  while( true ) {
    uVar8 = (ulong)uVar3;
    do {
      uVar3 = (uint)uVar8;
      if ((int)uVar3 <= iVar5) {
        Dir = 0;
        AdrModeA = 0;
        AdrModeB = 0;
        Op = 0;
        return 0;
      }
      uVar9 = (long)(int)(uVar3 + iVar5) / 2;
      uVar8 = uVar9 & 0xffffffff;
      iVar4 = (int)uVar9;
      lVar12 = 0;
      while( true ) {
        cVar1 = OpCode[lVar12];
        cVar2 = MnemTab[iVar4].Mnem[lVar12];
        if ((cVar1 == '\0') || (cVar1 != cVar2)) break;
        lVar12 = lVar12 + 1;
      }
    } while (cVar1 < cVar2);
    if (cVar1 <= cVar2) break;
    iVar5 = iVar4 + 1;
  }
  AdrModeA = MnemTab[iVar4].AMA;
  if (AdrModeA == 0xffff) {
    AdrModeB = 0;
    AdrModeA = 0;
    Op = 0;
    Dir = MnemTab[iVar4].AMB;
  }
  else {
    Op = MnemTab[iVar4].OpBits;
    AdrModeB = MnemTab[iVar4].AMB;
    Dir = 0;
  }
  return 1;
}

Assistant:

int Instructions(int loc)
/* Looks up opcode and addressing mode bit patterns
 If the opcode corresponds to an executable instruction,
 returns TRUE with the following fields set up:
 Op       - operation code bits
 AdrModeA - addressing mode bits
 AdrModeB - more addressing mode bits
 Dir      - None
 If the opcode corresponds to a directive (AdrModeA in the table
 is 0xFFFF), returns TRUE with the following fields set up:
 Op       - 0
 AdrModeA - 0
 AdrModeB - 0
 Dir      - the appropriate directive value
 If not found, returns FALSE with all the above fields set to zero.

 NOTE: The binary search doesn't use strcmp because this function
 returns incorrect values under MS-DOS Lattice 2.12.		      */
{

// For the love of god. strcmp is slower than C implementation. -- Alkis
//#define USESTRCMP
#ifdef USESTRCMP
	register int cmp;
#else
	register char *i, *j;
#endif
	register int lower, upper, mid; /* Binary search controls */

	if (optabsize == 0) { /* Determine size of opcode table. */
		while (MnemTab[optabsize].Mnem[0])
			optabsize++;
		oplimits[0] = 0;
		oplimits['Z' - 'A' + 1] = optabsize;
		mid = 0;
		for (lower = 0; lower < optabsize; lower++) {
			upper = (unsigned int) MnemTab[lower].Mnem[0] - 'A' + 1;
			if (upper != mid) {
				if (upper > 0) { /* Start of the next letter */
					mid++;
					while (mid < upper)
						oplimits[mid++] = lower;
					oplimits[mid] = lower;
				}
			}
		}
		mid++;
		while (mid < 'Z' - 'A' + 1) {
			oplimits[mid++] = optabsize; /* In case we didn't get to Z */
		}
	}

	mid = (unsigned int) OpCode[0] - 'A' + 1;
	if (mid < 0) { /* This catches stuff like "=". */
		lower = 0;
		upper = oplimits[1];
	} else if (mid > 'Z' - 'A' + 1) {
		lower = upper = 0; /* Reject this one. */
	} else {
		lower = oplimits[mid++];
		upper = oplimits[mid];
	}
	while (lower < upper) {
		mid = (lower + upper) / 2; /* Search the opcode table. */
#ifdef USESTRCMP
		cmp = strcmp(OpCode,MnemTab[mid].Mnem);
		if (cmp<0) {
			upper = mid; /* Search lower half of table. */
		} else if (cmp>0) {
			lower = mid + 1; /* Search upper half of table. */
#else
		for (i = OpCode, j = MnemTab[mid].Mnem; *i == *j; i++, j++)
			if (*i == '\0')
				break; /* Find the first non-match. */
		if (*i < *j) {
			upper = mid; /* Search lower half of table. */
		} else if (*i > *j) {
			lower = mid + 1; /* Search upper half of table. */
#endif
		}else if (MnemTab[mid].AMA != 0xFFFF) { /* Found it. */
			Op = MnemTab[mid].OpBits; /* Executable instruction */
			AdrModeA = MnemTab[mid].AMA;
			AdrModeB = MnemTab[mid].AMB;
			Dir = None;
			return (TRUE);
		} else {
			Op = AdrModeA = AdrModeB = 0; /* Directive */
			Dir = MnemTab[mid].AMB;
			return (TRUE);
		}
	}
	Op = AdrModeA = AdrModeB = Dir = 0;
	return (FALSE); /* We didn't find it. */
}